

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O3

void MWT::predict_or_learn<true,false,false>(mwt *c,single_learner *base,example *ec)

{
  bool bVar1;
  byte bVar2;
  vw *pvVar3;
  float *pfVar4;
  unsigned_long *puVar5;
  unsigned_long uVar6;
  double dVar7;
  ulong uVar8;
  uint64_t uVar9;
  cb_class *cl;
  cb_class *pcVar10;
  uint32_t *puVar11;
  long lVar12;
  uchar *puVar13;
  uint64_t *puVar14;
  ulong uVar15;
  features *pfVar16;
  unsigned_long *puVar17;
  ulong *puVar18;
  mwt *pmVar19;
  features *pfVar20;
  float *pfVar21;
  byte *pbVar22;
  policy_data *ppVar23;
  features *pfVar24;
  byte *pbVar25;
  byte bVar26;
  v_array<unsigned_char> *__range3;
  v_array<float> preds;
  v_array<float> local_f8;
  mwt *local_d0;
  single_learner *local_c8;
  ulong local_c0;
  features *local_b8;
  uint64_t local_b0;
  byte *local_a8;
  v_array<unsigned_char> *local_a0;
  float local_98 [24];
  float local_38;
  
  bVar26 = 0;
  pcVar10 = (cb_class *)(ec->l).cs.costs._begin;
  do {
    local_c8 = base;
    if (pcVar10 == (cb_class *)(ec->l).cs.costs._end) {
      c->observation = (cb_class *)0x0;
LAB_001a98b2:
      local_a0 = &c->indices;
      v_array<unsigned_char>::clear(local_a0);
      pvVar3 = c->all;
      bVar1 = (pvVar3->weights).sparse;
      puVar14 = &(pvVar3->weights).dense_weights._weight_mask;
      if (bVar1 != false) {
        puVar14 = &(pvVar3->weights).sparse_weights._weight_mask;
      }
      pbVar25 = (ec->super_example_predict).indices._begin;
      pbVar22 = (ec->super_example_predict).indices._end;
      pmVar19 = c;
      if (pbVar25 != pbVar22) {
        local_b0 = *puVar14;
        pfVar16 = (ec->super_example_predict).feature_space;
        puVar11 = &(pvVar3->weights).dense_weights._stride_shift;
        if (bVar1 != false) {
          puVar11 = &(pvVar3->weights).sparse_weights._stride_shift;
        }
        local_c0 = (ulong)*puVar11;
        local_d0 = c;
        local_b8 = pfVar16;
        local_a8 = pbVar22;
        do {
          local_f8._begin._0_4_ = CONCAT31(local_f8._begin._1_3_,*pbVar25);
          if (pmVar19->namespaces[*pbVar25] == true) {
            v_array<unsigned_char>::push_back(local_a0,(uchar *)&local_f8);
            features::clear(c->feature_space + (byte)local_f8._begin);
            uVar9 = local_b0;
            uVar8 = local_c0;
            uVar15 = (ulong)(byte)local_f8._begin;
            pfVar21 = pfVar16[uVar15].values._begin;
            pfVar4 = pfVar16[uVar15].values._end;
            if (pfVar21 != pfVar4) {
              puVar18 = pfVar16[uVar15].indicies._begin;
              do {
                uVar15 = (ulong)*pfVar21;
                features::push_back(c->feature_space + (byte)local_f8._begin,1.0,
                                    ((long)(*pfVar21 - 9.223372e+18) & (long)uVar15 >> 0x3f | uVar15
                                    ) + (ulong)local_d0->num_classes *
                                        ((*puVar18 & uVar9) >> ((byte)uVar8 & 0x3f)) <<
                                    ((byte)uVar8 & 0x3f));
                pfVar21 = pfVar21 + 1;
                puVar18 = puVar18 + 1;
              } while (pfVar21 != pfVar4);
              uVar15 = (ulong)(byte)local_f8._begin;
              pfVar16 = local_b8;
              pmVar19 = local_d0;
            }
            pfVar20 = c->feature_space + uVar15;
            pfVar21 = local_98;
            for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
              *(float **)pfVar21 = (pfVar20->values)._begin;
              pfVar20 = (features *)((long)pfVar20 + (ulong)bVar26 * -0x10 + 8);
              pfVar21 = pfVar21 + ((ulong)bVar26 * -2 + 1) * 2;
            }
            pfVar20 = pfVar16 + uVar15;
            pfVar24 = c->feature_space + uVar15;
            for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pfVar24->values)._begin = (pfVar20->values)._begin;
              pfVar20 = (features *)((long)pfVar20 + (ulong)bVar26 * -0x10 + 8);
              pfVar24 = (features *)((long)pfVar24 + (ulong)bVar26 * -0x10 + 8);
            }
            c->feature_space[uVar15].sum_feat_sq = pfVar16[uVar15].sum_feat_sq;
            pfVar21 = local_98;
            pfVar20 = pfVar16 + uVar15;
            for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pfVar20->values)._begin = *(float **)pfVar21;
              pfVar21 = pfVar21 + ((ulong)bVar26 * -2 + 1) * 2;
              pfVar20 = (features *)((long)pfVar20 + (ulong)bVar26 * -0x10 + 8);
            }
            pfVar16[uVar15].sum_feat_sq = local_38;
            pbVar22 = local_a8;
          }
          pbVar25 = pbVar25 + 1;
        } while (pbVar25 != pbVar22);
      }
      local_f8._begin._0_4_ = (ec->pred).multiclass;
      local_f8._begin._4_4_ = *(undefined4 *)((long)&ec->pred + 4);
      local_f8._end._0_4_ = *(undefined4 *)((long)&ec->pred + 8);
      local_f8._end._4_4_ = *(undefined4 *)((long)&ec->pred + 0xc);
      local_f8.end_array._0_4_ = *(undefined4 *)((long)&ec->pred + 0x10);
      local_f8.end_array._4_4_ = *(undefined4 *)((long)&ec->pred + 0x14);
      local_f8.erase_count._0_4_ = *(undefined4 *)((long)&ec->pred + 0x18);
      local_f8.erase_count._4_4_ = *(undefined4 *)((long)&ec->pred + 0x1c);
      (**(code **)(local_c8 + 0x30))
                (*(undefined8 *)(local_c8 + 0x18),*(undefined8 *)(local_c8 + 0x20),ec);
      puVar13 = (pmVar19->indices)._end;
      if (puVar13 != (pmVar19->indices)._begin) {
        do {
          (pmVar19->indices)._end = puVar13 + -1;
          bVar2 = puVar13[-1];
          pfVar16 = (ec->super_example_predict).feature_space + bVar2;
          pfVar20 = pmVar19->feature_space + bVar2;
          pfVar21 = local_98;
          for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
            *(float **)pfVar21 = (pfVar20->values)._begin;
            pfVar20 = (features *)((long)pfVar20 + (ulong)bVar26 * -0x10 + 8);
            pfVar21 = pfVar21 + ((ulong)bVar26 * -2 + 1) * 2;
          }
          pfVar20 = pfVar16;
          pfVar24 = pmVar19->feature_space + bVar2;
          for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pfVar24->values)._begin = (pfVar20->values)._begin;
            pfVar20 = (features *)((long)pfVar20 + ((ulong)bVar26 * -2 + 1) * 8);
            pfVar24 = (features *)((long)pfVar24 + (ulong)bVar26 * -0x10 + 8);
          }
          pmVar19->feature_space[bVar2].sum_feat_sq =
               (ec->super_example_predict).feature_space[bVar2].sum_feat_sq;
          pfVar21 = local_98;
          for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pfVar16->values)._begin = *(float **)pfVar21;
            pfVar21 = pfVar21 + ((ulong)bVar26 * -2 + 1) * 2;
            pfVar16 = (features *)((long)pfVar16 + ((ulong)bVar26 * -2 + 1) * 8);
          }
          (ec->super_example_predict).feature_space[bVar2].sum_feat_sq = local_38;
          puVar13 = (pmVar19->indices)._end;
        } while (puVar13 != (pmVar19->indices)._begin);
      }
      v_array<float>::clear(&local_f8);
      local_98[0] = (float)(ec->pred).multiclass;
      v_array<float>::push_back(&local_f8,local_98);
      puVar17 = (pmVar19->policies)._begin;
      puVar5 = (pmVar19->policies)._end;
      if (puVar17 != puVar5) {
        do {
          local_98[0] = (float)(pmVar19->evals)._begin[*puVar17].cost / (float)pmVar19->total;
          v_array<float>::push_back(&local_f8,local_98);
          puVar17 = puVar17 + 1;
        } while (puVar17 != puVar5);
      }
      (ec->pred).scalars.end_array =
           (float *)CONCAT44(local_f8.end_array._4_4_,local_f8.end_array._0_4_);
      (ec->pred).scalars.erase_count =
           CONCAT44(local_f8.erase_count._4_4_,(undefined4)local_f8.erase_count);
      (ec->pred).scalars._begin = (float *)CONCAT44(local_f8._begin._4_4_,(uint32_t)local_f8._begin)
      ;
      (ec->pred).scalars._end = (float *)CONCAT44(local_f8._end._4_4_,local_f8._end._0_4_);
      return;
    }
    if ((pcVar10 != (cb_class *)0x0) &&
       (((pcVar10->cost != 3.4028235e+38 || (NAN(pcVar10->cost))) && (0.0 < pcVar10->probability))))
    {
      c->observation = pcVar10;
      c->total = c->total + 1.0;
      pbVar22 = (ec->super_example_predict).indices._end;
      for (pbVar25 = (ec->super_example_predict).indices._begin; pbVar25 != pbVar22;
          pbVar25 = pbVar25 + 1) {
        bVar2 = *pbVar25;
        if (c->namespaces[bVar2] == true) {
          pfVar21 = (ec->super_example_predict).feature_space[bVar2].values._begin;
          pfVar4 = (ec->super_example_predict).feature_space[bVar2].values._end;
          if (pfVar21 != pfVar4) {
            puVar14 = (ec->super_example_predict).feature_space[bVar2].indicies._begin;
            do {
              value_policy(c,*pfVar21,*puVar14);
              pfVar21 = pfVar21 + 1;
              puVar14 = puVar14 + 1;
            } while (pfVar21 != pfVar4);
          }
        }
      }
      puVar5 = (c->policies)._end;
      for (puVar17 = (c->policies)._begin; puVar17 != puVar5; puVar17 = puVar17 + 1) {
        uVar6 = *puVar17;
        ppVar23 = (c->evals)._begin;
        pcVar10 = c->observation;
        dVar7 = 0.0;
        if (pcVar10->action == ppVar23[uVar6].action) {
          dVar7 = (double)(pcVar10->cost / pcVar10->probability);
        }
        ppVar23 = ppVar23 + uVar6;
        ppVar23->cost = dVar7 + ppVar23->cost;
        (c->evals)._begin[uVar6].action = 0;
      }
      goto LAB_001a98b2;
    }
    pcVar10 = pcVar10 + 1;
  } while( true );
}

Assistant:

void predict_or_learn(mwt& c, single_learner& base, example& ec)
{
  c.observation = get_observed_cost(ec.l.cb);

  if (c.observation != nullptr)
  {
    c.total++;
    // For each nonzero feature in observed namespaces, check it's value.
    for (unsigned char ns : ec.indices)
      if (c.namespaces[ns])
        GD::foreach_feature<mwt, value_policy>(c.all, ec.feature_space[ns], c);
    for (uint64_t policy : c.policies)
    {
      c.evals[policy].cost += get_unbiased_cost(c.observation, c.evals[policy].action);
      c.evals[policy].action = 0;
    }
  }
  if (exclude || learn)
  {
    c.indices.clear();
    uint32_t stride_shift = c.all->weights.stride_shift();
    uint64_t weight_mask = c.all->weights.mask();
    for (unsigned char ns : ec.indices)
      if (c.namespaces[ns])
      {
        c.indices.push_back(ns);
        if (learn)
        {
          c.feature_space[ns].clear();
          for (features::iterator& f : ec.feature_space[ns])
          {
            uint64_t new_index = ((f.index() & weight_mask) >> stride_shift) * c.num_classes + (uint64_t)f.value();
            c.feature_space[ns].push_back(1, new_index << stride_shift);
          }
        }
        std::swap(c.feature_space[ns], ec.feature_space[ns]);
      }
  }

  // modify the predictions to use a vector with a score for each evaluated feature.
  v_array<float> preds = ec.pred.scalars;

  if (learn)
  {
    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);
  }

  if (exclude || learn)
    while (c.indices.size() > 0)
    {
      unsigned char ns = c.indices.pop();
      swap(c.feature_space[ns], ec.feature_space[ns]);
    }

  // modify the predictions to use a vector with a score for each evaluated feature.
  preds.clear();
  if (learn)
    preds.push_back((float)ec.pred.multiclass);
  for (uint64_t index : c.policies) preds.push_back((float)c.evals[index].cost / (float)c.total);

  ec.pred.scalars = preds;
}